

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_mutex.c
# Opt level: O3

void s_mutex_unlock(s_mutex_t *mutex)

{
  int iVar1;
  s_list_t *node;
  long *in_FS_OFFSET;
  
  iVar1 = s_list_is_empty(&mutex->wait_list);
  if (iVar1 == 0) {
    node = s_list_get_next(&mutex->wait_list);
    s_list_detach(node);
    s_list_attach((s_list_t *)(*in_FS_OFFSET + -0xf8),node);
    iVar1 = s_list_is_empty(&mutex->wait_list);
    if (iVar1 != 0) {
      s_list_detach(&mutex->self);
      return;
    }
  }
  else {
    mutex->locked = false;
  }
  return;
}

Assistant:

void s_mutex_unlock(s_mutex_t *mutex) {
    if(s_list_is_empty(&mutex->wait_list))
        mutex->locked = false;
    else {
        s_list_t *next = s_list_get_next(&mutex->wait_list);
        s_list_detach(next);
        s_list_attach(&g_globals.active_tasks, next);
        s_mutex_remove_from_waiting_list(mutex);        
    }
}